

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O1

bool duckdb::VectorCastHelpers::
     TryCastLoop<unsigned_short,duckdb::uhugeint_t,duckdb::NumericTryCast>
               (Vector *source,Vector *result,idx_t count,CastParameters *parameters)

{
  VectorTryCastData input;
  Vector *local_20;
  CastParameters *local_18;
  undefined1 local_10;
  
  local_10 = 1;
  local_20 = result;
  local_18 = parameters;
  UnaryExecutor::
  ExecuteStandard<unsigned_short,duckdb::uhugeint_t,duckdb::GenericUnaryWrapper,duckdb::VectorTryCastOperator<duckdb::NumericTryCast>>
            (source,result,count,&local_20,parameters->error_message != (string *)0x0,
             CAN_THROW_RUNTIME_ERROR);
  return (bool)local_10;
}

Assistant:

static bool TryCastLoop(Vector &source, Vector &result, idx_t count, CastParameters &parameters) {
		return TemplatedTryCastLoop<SRC, DST, VectorTryCastOperator<OP>>(source, result, count, parameters);
	}